

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::ConstValue::display(ConstValue *this,ostream *o)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  ostream *poVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  int i;
  ulong uVar12;
  
  puVar1 = &this->field_0x8;
  cVar2 = this->field_0x28;
  if (cVar2 == '\0') {
    poVar7 = std::operator<<(o,"\t.word ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    return;
  }
  if (cVar2 == '\x01') {
    piVar8 = *(int **)&this->field_0x8;
    iVar10 = 1;
    bVar6 = true;
    iVar9 = *piVar8;
    for (uVar12 = 1; uVar12 < (ulong)(*(long *)&this->field_0x10 - (long)piVar8 >> 2);
        uVar12 = uVar12 + 1) {
      iVar3 = piVar8[uVar12];
      if (bVar6) {
        if (iVar3 == iVar9) {
LAB_0018e89c:
          iVar10 = iVar10 + 1;
        }
        else {
          poVar7 = std::endl<char,std::char_traits<char>>(o);
          pcVar11 = "\t.word ";
LAB_0018e8b0:
          poVar7 = std::operator<<(poVar7,pcVar11);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        }
        bVar6 = false;
      }
      else {
        if (iVar3 == iVar9) goto LAB_0018e89c;
        if (iVar10 < 2) {
          pcVar11 = ", ";
          poVar7 = o;
          goto LAB_0018e8b0;
        }
        poVar7 = std::endl<char,std::char_traits<char>>(o);
        poVar7 = std::operator<<(poVar7,"\t.fill ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10);
        poVar7 = std::operator<<(poVar7,", 4, ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        bVar6 = true;
        iVar10 = 1;
      }
      piVar8 = *(int **)puVar1;
      iVar9 = iVar3;
    }
    if (iVar10 < 2) {
      pcVar11 = ", ";
      poVar7 = o;
    }
    else {
      std::endl<char,std::char_traits<char>>(o);
      poVar7 = std::operator<<(o,"\t.fill ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar10);
      pcVar11 = ", 4, ";
    }
    poVar7 = std::operator<<(poVar7,pcVar11);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    if ((this->len).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == true) {
      lVar4 = *(long *)&this->field_0x10;
      lVar5 = *(long *)puVar1;
      piVar8 = std::optional<int>::value(&this->len);
      if ((ulong)(lVar4 - lVar5 >> 2) < (ulong)(long)*piVar8) {
        poVar7 = std::operator<<(o,"\t.fill ");
        std::optional<int>::value(&this->len);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,", 4, ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        return;
      }
    }
  }
  else if (cVar2 == '\x02') {
    if (this->ty == Word) {
      poVar7 = std::operator<<(o,"\t.word ");
      std::operator<<(poVar7,(string *)puVar1);
      return;
    }
    if (this->ty == AsciZ) {
      poVar7 = std::operator<<(o,"\t.asciz \"");
      poVar7 = std::operator<<(poVar7,(string *)puVar1);
      std::operator<<(poVar7,"\"");
      return;
    }
  }
  return;
}

Assistant:

void ConstValue::display(std::ostream &o) const {
  if (auto x = std::get_if<uint32_t>(this)) {
    o << "\t.word " << *x;
  } else if (auto x = std::get_if<std::vector<uint32_t>>(this)) {
    uint32_t last = x->front();
    int repeat_count = 1;
    bool newline = true;
    for (int i = 1; i < x->size(); i++) {
      uint32_t new_item = (*x)[i];
      if (newline) {
        if (new_item == last) {
          repeat_count++;
        } else {
          o << std::endl << "\t.word " << last;
        }
        newline = false;
      } else {
        if (new_item == last) {
          repeat_count++;
        } else {
          if (repeat_count > 1) {
            o << std::endl << "\t.fill " << repeat_count << ", 4, " << last;
            newline = true;
            repeat_count = 1;
          } else {
            o << ", " << last;
          }
        }
      }
      last = new_item;
    }
    if (repeat_count > 1) {
      o << std::endl;
      o << "\t.fill " << repeat_count << ", 4, " << last << std::endl;
      newline = true;
      repeat_count = 1;
    } else {
      o << ", " << last << std::endl;
    }
    if (len && x->size() < len.value()) {
      o << "\t.fill " << (len.value() - x->size()) << ", 4, " << last
        << std::endl;
    }
  } else if (auto x = std::get_if<std::string>(this)) {
    if (ty == ConstType::AsciZ)
      o << "\t.asciz \"" << *x << "\"";
    else if (ty == ConstType::Word)
      o << "\t.word " << *x;
  }
}